

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_deflate_concurrency.cc
# Opt level: O2

void __thiscall Mutator::run(Mutator *this)

{
  long lVar1;
  
  while( true ) {
    do {
      LOCK();
      (this->m_state)._M_i = (this->m_target_state)._M_i;
      UNLOCK();
    } while ((this->m_state)._M_i == PAUSED);
    if ((this->m_state)._M_i == STOPPED) break;
    for (lVar1 = 0; lVar1 != 0x2000; lVar1 = lVar1 + 1) {
      ::buf[lVar1] = ::buf[lVar1] + '\x01';
    }
  }
  return;
}

Assistant:

void run() {
        while (true) {
            m_state.store(m_target_state);
            if (m_state == State::PAUSED)
                continue;
            if (m_state == State::STOPPED)
                break;
            for (uint8_t & i: buf)
                i++;
        }
    }